

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O2

exr_result_t unpack_half_to_float_3chan_planar(exr_decode_pipeline_t *decode)

{
  int w;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  exr_coding_channel_info_t *peVar5;
  long lVar6;
  int iVar7;
  float *out;
  uint16_t *in;
  float *out_00;
  float *out_01;
  bool bVar8;
  
  peVar5 = decode->channels;
  w = peVar5->width;
  lVar6 = (long)w;
  iVar1 = (decode->chunk).height;
  iVar2 = peVar5->user_line_stride;
  iVar3 = peVar5[1].user_line_stride;
  iVar4 = peVar5[2].user_line_stride;
  out_01 = (float *)(peVar5->field_12).decode_to_ptr;
  out_00 = (float *)peVar5[1].field_12.decode_to_ptr;
  iVar7 = 0;
  if (0 < iVar1) {
    iVar7 = iVar1;
  }
  out = (float *)peVar5[2].field_12.decode_to_ptr;
  in = (uint16_t *)decode->unpacked_buffer;
  while (bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, bVar8) {
    half_to_float_buffer(out_01,in,w);
    half_to_float_buffer(out_00,in + lVar6,w);
    half_to_float_buffer(out,in + lVar6 * 2,w);
    out_01 = (float *)((long)out_01 + (long)iVar2);
    out_00 = (float *)((long)out_00 + (long)iVar3);
    out = (float *)((long)out + (long)iVar4);
    in = in + lVar6 * 3;
  }
  return 0;
}

Assistant:

static exr_result_t
unpack_half_to_float_3chan_planar (exr_decode_pipeline_t* decode)
{
    /* we know we're unpacking all the channels and there is no subsampling */
    const uint8_t*  srcbuffer = (const uint8_t*) decode->unpacked_buffer;
    const uint16_t *in0, *in1, *in2;
    uint8_t *       out0, *out1, *out2;
    int             w, h;
    int             linc0, linc1, linc2;

    w     = decode->channels[0].width;
    h     = decode->chunk.height;
    linc0 = decode->channels[0].user_line_stride;
    linc1 = decode->channels[1].user_line_stride;
    linc2 = decode->channels[2].user_line_stride;

    out0 = decode->channels[0].decode_to_ptr;
    out1 = decode->channels[1].decode_to_ptr;
    out2 = decode->channels[2].decode_to_ptr;

    // planar output
    for (int y = 0; y < h; ++y)
    {
        in0 = (const uint16_t*) srcbuffer;
        in1 = in0 + w;
        in2 = in1 + w;
        srcbuffer += w * 6; // 3 * sizeof(uint16_t), avoid type conversion
                            /* specialise to memcpy if we can */
        half_to_float_buffer ((float*) out0, in0, w);
        half_to_float_buffer ((float*) out1, in1, w);
        half_to_float_buffer ((float*) out2, in2, w);

        out0 += linc0;
        out1 += linc1;
        out2 += linc2;
    }

    return EXR_ERR_SUCCESS;
}